

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  size_type sVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  ostringstream *this_00;
  LogMessage local_1b0;
  
  sVar2 = rewrite->size_;
  bVar6 = (long)sVar2 < 1;
  if (0 < (long)sVar2) {
    pcVar8 = rewrite->data_;
    pcVar7 = pcVar8 + sVar2;
    do {
      this_00 = &local_1b0.str_;
      if (*pcVar8 == '\\') {
        pcVar8 = pcVar8 + 1;
        iVar5 = -1;
        if (pcVar8 < pcVar7) {
          iVar5 = (int)*pcVar8;
        }
        uVar1 = iVar5 - 0x30;
        if (9 < uVar1) {
          if (iVar5 != 0x5c) {
            if ((this->options_).log_errors_ != true) {
              return bVar6;
            }
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x3af);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"invalid rewrite pattern: ",0x19);
            pcVar8 = rewrite->data_;
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
            }
            else {
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar8,sVar4);
            }
            LogMessage::~LogMessage(&local_1b0);
            return bVar6;
          }
          goto LAB_001aa5a7;
        }
        if ((int)uVar1 < veclen) {
          if (vec[uVar1].size_ != 0) {
            std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].data_);
          }
        }
        else if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x3a3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"requested group ",0x10);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)this_00,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," in regexp ",0xb);
          __s = rewrite->data_;
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
          }
          LogMessage::~LogMessage(&local_1b0);
        }
        if (veclen <= (int)uVar1) {
          return bVar6;
        }
      }
      else {
LAB_001aa5a7:
        std::__cxx11::string::push_back((char)out);
      }
      pcVar8 = pcVar8 + 1;
      bVar6 = pcVar8 >= pcVar7;
    } while (pcVar8 < pcVar7);
  }
  return bVar6;
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}